

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::getCoins
          (vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>
           *__return_storage_ptr__,WalletImpl *this,
          vector<COutPoint,_std::allocator<COutPoint>_> *outputs)

{
  uint32_t uVar1;
  key_type *pkVar2;
  CWallet *this_00;
  long lVar3;
  int iVar4;
  iterator iVar5;
  uchar *__k;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  WalletTxOut local_a0;
  COutPoint local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock30,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x1e5,false);
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>::
  reserve(__return_storage_ptr__,(*(long *)(outputs + 8) - *(long *)outputs) / 0x24);
  pkVar2 = *(key_type **)(outputs + 8);
  for (__k = *(uchar **)outputs; (key_type *)__k != pkVar2; __k = __k + 0x24) {
    _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>::
    emplace_back<>(__return_storage_ptr__);
    iVar5 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(((this->m_wallet).
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    mapWallet)._M_h,(key_type *)__k);
    if (iVar5.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
        (__node_type *)0x0) {
      iVar4 = CWallet::GetTxDepthInMainChain
                        ((this->m_wallet).
                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (CWalletTx *)
                         ((long)iVar5.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
      if (-1 < iVar4) {
        this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        uVar1 = *(uint32_t *)(((key_type *)(__k + 0x20))->super_base_blob<256U>).m_data._M_elems;
        interfaces::WalletTxOut::WalletTxOut(&local_a0);
        CTxOut::operator=(&local_a0.txout,
                          (CTxOut *)
                          ((long)(int)uVar1 * 0x28 +
                          *(long *)(*(long *)((long)iVar5.
                                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                                  ._M_cur + 0x1c0) + 0x18)));
        local_a0.time =
             CWalletTx::GetTxTime
                       ((CWalletTx *)
                        ((long)iVar5.
                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               ._M_cur + 0x28));
        lVar3 = *(long *)((long)iVar5.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x1c0);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(lVar3 + 0x39);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)(lVar3 + 0x41);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)(lVar3 + 0x49);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)(lVar3 + 0x51);
        local_a0.depth_in_main_chain = iVar4;
        local_68.n = uVar1;
        local_a0.is_spent = CWallet::IsSpent(this_00,&local_68);
        interfaces::WalletTxOut::operator=
                  ((__return_storage_ptr__->
                   super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1,&local_a0);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&local_a0.txout.scriptPubKey.super_CScriptBase);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletTxOut> getCoins(const std::vector<COutPoint>& outputs) override
    {
        LOCK(m_wallet->cs_wallet);
        std::vector<WalletTxOut> result;
        result.reserve(outputs.size());
        for (const auto& output : outputs) {
            result.emplace_back();
            auto it = m_wallet->mapWallet.find(output.hash);
            if (it != m_wallet->mapWallet.end()) {
                int depth = m_wallet->GetTxDepthInMainChain(it->second);
                if (depth >= 0) {
                    result.back() = MakeWalletTxOut(*m_wallet, it->second, output.n, depth);
                }
            }
        }
        return result;
    }